

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

unsigned_long_long
ImGui::ScaleValueFromRatioT<unsigned_long_long,long_long,double>
          (ImGuiDataType data_type,float t,unsigned_long_long v_min,unsigned_long_long v_max,
          bool is_logarithmic,float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  undefined1 auVar1 [16];
  unsigned_long_long uVar2;
  byte in_CL;
  ulong in_RDX;
  unsigned_long_long in_RSI;
  int in_EDI;
  float in_XMM0_Da;
  float fVar3;
  double dVar4;
  double dVar5;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float in_XMM1_Da;
  float in_XMM2_Da;
  double v_new_off_f;
  float zero_point_snap_R;
  float zero_point_snap_L;
  float zero_point_center;
  float t_with_flip;
  double v_max_fudged;
  double v_min_fudged;
  bool flipped;
  unsigned_long_long result;
  bool is_floating_point;
  double in_stack_ffffffffffffff18;
  double in_stack_ffffffffffffff20;
  float local_8c;
  double local_88;
  float local_7c;
  double local_78;
  float local_70;
  bool local_69;
  double local_50;
  double local_48;
  byte local_39;
  unsigned_long_long local_38;
  bool local_2d;
  float local_2c;
  float local_28;
  byte local_21;
  ulong local_20;
  unsigned_long_long local_18;
  float local_10;
  unsigned_long_long local_8;
  
  local_21 = in_CL & 1;
  local_8 = in_RSI;
  if (in_RSI != in_RDX) {
    local_69 = in_EDI == 8 || in_EDI == 9;
    local_2d = local_69;
    if (local_21 == 0) {
      if (in_EDI == 8 || in_EDI == 9) {
        local_38 = ImLerp<unsigned_long_long>(in_RSI,in_RDX,in_XMM0_Da);
      }
      else {
        local_38 = in_RDX;
        if (in_XMM0_Da < 1.0) {
          fVar3 = -0.5;
          if (in_RSI <= in_RDX) {
            fVar3 = 0.5;
          }
          local_38 = in_RSI + (long)((float)(long)(in_RDX - in_RSI) * in_XMM0_Da + fVar3);
        }
      }
    }
    else {
      local_38 = in_RSI;
      if ((0.0 < in_XMM0_Da) && (local_38 = in_RDX, in_XMM0_Da < 1.0)) {
        local_39 = in_RDX < in_RSI;
        auVar6 = vcvtusi2sd_avx512f(ZEXT416((uint)in_XMM0_Da),in_RSI);
        local_2c = in_XMM2_Da;
        local_28 = in_XMM1_Da;
        local_20 = in_RDX;
        local_18 = in_RSI;
        local_10 = in_XMM0_Da;
        dVar4 = ImAbs(auVar6._0_8_);
        auVar6._0_8_ = (double)local_28;
        auVar6._8_8_ = extraout_XMM0_Qb;
        if (auVar6._0_8_ <= dVar4) {
          auVar6 = vcvtusi2sd_avx512f(auVar6,local_18);
          local_78 = auVar6._0_8_;
        }
        else {
          auVar6 = vcvtusi2ss_avx512f(auVar6,local_18);
          if (0.0 <= auVar6._0_4_) {
            local_70 = local_28;
          }
          else {
            local_70 = -local_28;
          }
          local_78 = (double)local_70;
        }
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_78;
        local_48 = local_78;
        auVar6 = vcvtusi2sd_avx512f(auVar7,local_20);
        dVar4 = ImAbs(auVar6._0_8_);
        auVar8._0_8_ = (double)local_28;
        auVar8._8_8_ = extraout_XMM0_Qb_00;
        if (auVar8._0_8_ <= dVar4) {
          auVar6 = vcvtusi2sd_avx512f(auVar8,local_20);
          local_88 = auVar6._0_8_;
        }
        else {
          auVar6 = vcvtusi2ss_avx512f(auVar8,local_20);
          if (0.0 <= auVar6._0_4_) {
            local_7c = local_28;
          }
          else {
            local_7c = -local_28;
          }
          local_88 = (double)local_7c;
        }
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_88;
        local_50 = local_88;
        if ((local_39 & 1) != 0) {
          ImSwap<double>(&local_48,&local_50);
        }
        dVar4 = local_48;
        auVar6 = vcvtusi2ss_avx512f(auVar9,local_20);
        if (((auVar6._0_4_ == 0.0) && (!NAN(auVar6._0_4_))) &&
           (auVar6 = vcvtusi2ss_avx512f(auVar6,local_18), auVar6._0_4_ < 0.0)) {
          local_50 = (double)-local_28;
        }
        dVar5 = local_50;
        if ((local_39 & 1) == 0) {
          local_8c = local_10;
        }
        else {
          local_8c = 1.0 - local_10;
        }
        auVar6 = vcvtusi2ss_avx512f(ZEXT416((uint)local_8c),local_18 * local_20);
        auVar7 = (undefined1  [16])0x0;
        if (0.0 <= auVar6._0_4_) {
          auVar6 = vcvtusi2ss_avx512f((undefined1  [16])0x0,local_18);
          if ((auVar6._0_4_ < 0.0) ||
             (auVar6 = vcvtusi2ss_avx512f((undefined1  [16])0x0,local_20), auVar6._0_4_ < 0.0)) {
            dVar4 = ImPow(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
            auVar12._8_8_ = 0;
            auVar12._0_8_ = dVar5 * dVar4;
            local_38 = vcvttsd2usi_avx512f(auVar12);
          }
          else {
            dVar5 = ImPow(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
            auVar13._8_8_ = 0;
            auVar13._0_8_ = dVar4 * dVar5;
            local_38 = vcvttsd2usi_avx512f(auVar13);
          }
        }
        else {
          uVar2 = ImMin<unsigned_long_long>(local_18,local_20);
          auVar7 = vcvtusi2ss_avx512f(auVar7,uVar2);
          auVar8 = vcvtusi2ss_avx512f(ZEXT416((uint)-auVar7._0_4_),local_20);
          auVar6 = vcvtusi2ss_avx512f(auVar6,local_18);
          fVar3 = ImAbs(auVar8._0_4_ - auVar6._0_4_);
          fVar3 = -auVar7._0_4_ / fVar3;
          if ((local_8c < fVar3 - local_2c) || (fVar3 + local_2c < local_8c)) {
            if (fVar3 <= local_8c) {
              dVar4 = ImPow(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
              auVar11._8_8_ = 0;
              auVar11._0_8_ = (double)local_28 * dVar4;
              local_38 = vcvttsd2usi_avx512f(auVar11);
            }
            else {
              dVar4 = ImPow(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
              auVar1._8_8_ = 0x8000000000000000;
              auVar1._0_8_ = 0x8000000000000000;
              auVar10._8_8_ = 0;
              auVar10._0_8_ = (double)local_28 * dVar4;
              local_38 = vcvttsd2usi_avx512f(auVar10 ^ auVar1);
            }
          }
          else {
            local_38 = 0;
          }
        }
      }
    }
    local_8 = local_38;
  }
  return local_8;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return v_min;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    TYPE result;
    if (is_logarithmic)
    {
        // We special-case the extents because otherwise our fudging can lead to "mathematically correct" but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value
        if (t <= 0.0f)
            result = v_min;
        else if (t >= 1.0f)
            result = v_max;
        else
        {
            bool flipped = v_max < v_min; // Check if range is "backwards"

            // Fudge min/max to avoid getting silly results close to zero
            FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
            FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

            if (flipped)
                ImSwap(v_min_fudged, v_max_fudged);

            // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
            if ((v_max == 0.0f) && (v_min < 0.0f))
                v_max_fudged = -logarithmic_zero_epsilon;

            float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

            if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
            {
                float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
                float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
                float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
                if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                    result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
                else if (t_with_flip < zero_point_center)
                    result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
                else
                    result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
            }
            else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
                result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
            else
                result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
        }
    }
    else
    {
        // Linear slider
        if (is_floating_point)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            if (t < 1.0)
            {
                FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
                result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
            }
            else
            {
                result = v_max;
            }
        }
    }

    return result;
}